

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

Scope * __thiscall Scope::SortAndUnique(Scope *this)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer __dest;
  pointer puVar3;
  pointer puVar4;
  
  Sort(this);
  puVar4 = (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  __dest = puVar4 + 1;
  if (puVar4 + 1 != puVar2) {
    do {
      if (puVar4[1] == *puVar4) {
        puVar3 = __dest + 1;
        if (puVar3 != puVar2) {
          memmove(__dest,puVar3,(long)puVar2 - (long)puVar3);
        }
        ppuVar1 = &(this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
        puVar3 = __dest;
      }
      else {
        puVar3 = __dest + 1;
        puVar4 = __dest;
      }
      puVar2 = (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      __dest = puVar3;
    } while (puVar3 != puVar2);
  }
  return this;
}

Assistant:

Scope& Scope::SortAndUnique()
{
    Sort();
    SDT::iterator prev=begin();
    for (SDT::iterator it=++begin();it!=end();)
    {
        if (*it==*prev)
            erase(it);
        else
        {
            prev=it;
            ++it;
        }
    }
    return *this;
}